

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int read_mdef(char *moddeffn,model_def_t **out_mdef,uint32 *out_gau_begin,int32 *cb2mllr)

{
  model_def_t *pmVar1;
  int32 iVar2;
  int extraout_EAX;
  ulong uVar3;
  uint uVar4;
  
  if (moddeffn == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x78,"-moddeffn is not given.\n");
  }
  else {
    iVar2 = model_def_read(out_mdef,moddeffn);
    if (iVar2 == 0) {
      if (cb2mllr == (int32 *)0x0) {
        cb2mllr = (int32 *)__ckd_calloc__((ulong)(*out_mdef)->n_total_state,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                                          ,0x7f);
      }
      pmVar1 = *out_mdef;
      uVar4 = pmVar1->n_tied_ci_state;
      *out_gau_begin = uVar4;
      for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
        cb2mllr[uVar3] = -1;
        uVar4 = *out_gau_begin;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x85,"Use CD senones only. (index >= %d)\n",(ulong)pmVar1->n_tied_ci_state);
      return extraout_EAX;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x7b,"Can not read model definition file %s\n",moddeffn);
  }
  exit(1);
}

Assistant:

static int
read_mdef(const char *moddeffn,
	  model_def_t **out_mdef,
	  uint32 *out_gau_begin,
	  int32 *cb2mllr)
{
    uint32 i;

    if (! moddeffn) {
	E_FATAL("-moddeffn is not given.\n");
    }
    else if (model_def_read(out_mdef, moddeffn) != S3_SUCCESS) {
	E_FATAL("Can not read model definition file %s\n", moddeffn);
    }

    if (cb2mllr == NULL)
	cb2mllr = (int32 *)ckd_calloc((*out_mdef)->n_total_state,sizeof(char));
	
    *out_gau_begin = (*out_mdef)->n_tied_ci_state;
    for (i = 0; i < *out_gau_begin; i++) {
	cb2mllr[i] = -1;                    /* skip CI senones */
    }
    E_INFO("Use CD senones only. (index >= %d)\n",(*out_mdef)->n_tied_ci_state);

    return S3_SUCCESS;
}